

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtransaction.cpp
# Opt level: O1

void __thiscall
ConfidentialTransaction_BlindTxOutTest_Test::~ConfidentialTransaction_BlindTxOutTest_Test
          (ConfidentialTransaction_BlindTxOutTest_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(ConfidentialTransaction, BlindTxOutTest) {
  std::string tx_hex = "020000000001e6162f9bbac022e67327e717a3885b316a54e50c34ba266b58f1999854c596810100000000ffffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000138800017a914a3949e9a8b0b813db67c8fc5ad14194a297979cd870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a0100000000000027100017a9145227b0820cf08f489873888672a5d97face863b2870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000002710000000000000";
  ConfidentialTransaction tx(tx_hex);
  double inputamount = 0.001;
  std::string inputblinder =
      "55bf185ddc2d1c747da2a82b8c9954179edec0af886daaf98d8a7b862e78bcee";
  std::string inputasset =
      "5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225";
  std::string inputassetblinder =
      "95e6e0912047f088394be103f3a1761adcbd92466abfe41f0964a3aa2fc201e5";
  std::string pubkey1_hex =
      "0213c4451645063e1edd5fe76e5194864c2246d4c4e6c8df5a305224046e1ea2c4";
  std::string privkey1_hex =
      "66e4df5035a64acef16b4aa52ddc8bebd22b22c9eca150774e355abc72909d83";
  std::string pubkey2_hex =
      "0222722d38de0463756bdfc460de0547a89e17159150d07b6cf69029ba33adf967";
  std::string privkey2_hex =
      "715b3d80726388b7daff92388f82c8ddf5ee7248900552a0bcd16d7d46b439c0";
  Pubkey pubkey1(pubkey1_hex);
  Privkey privkey1(privkey1_hex);
  Pubkey pubkey2(pubkey2_hex);
  Privkey privkey2(privkey2_hex);

  std::vector<BlindParameter> blind_list;
  BlindParameter param;
  param.asset = ConfidentialAssetId(inputasset);
  param.abf = BlindFactor(inputassetblinder);
  param.vbf = BlindFactor(inputblinder);
  param.value = ConfidentialValue(Amount::CreateByCoinAmount(inputamount));
  blind_list.push_back(param);
  std::vector<Pubkey> pubkeys;
  pubkeys.push_back(pubkey1);
  pubkeys.push_back(pubkey2);
  pubkeys.push_back(Pubkey());

  EXPECT_NO_THROW((tx.BlindTxOut(blind_list, pubkeys)));
  // Only check the size, as it will be mixed with random numbers.
  EXPECT_EQ(tx.GetHex().length(), 17676);
  std::string blind_tx = tx.GetHex();

  // sighash test
  auto script = ScriptUtil::CreateP2pkLockingScript(pubkey1);
  SigHashType sig_hash_type(SigHashAlgorithm::kSigHashAll);
  sig_hash_type.SetRangeproof(true);
  ByteData256 byte_data1;
  EXPECT_NO_THROW(
      (byte_data1 = tx.GetElementsSignatureHash(0, script.GetData(), sig_hash_type)));

  sig_hash_type.SetRangeproof(false);
  ByteData256 byte_data2;
  EXPECT_NO_THROW(
      (byte_data2 = tx.GetElementsSignatureHash(0, script.GetData(), sig_hash_type)));
  EXPECT_NE(byte_data1.GetHex(), byte_data2.GetHex());

  std::vector<Privkey> blinding_keys;
  blinding_keys.push_back(privkey1);
  blinding_keys.push_back(privkey2);
  blinding_keys.push_back(Privkey());
  std::vector<UnblindParameter> unblindList;
  EXPECT_NO_THROW((unblindList = tx.UnblindTxOut(blinding_keys)));
  EXPECT_STREQ(tx.GetHex().c_str(), tx_hex.c_str());
  EXPECT_EQ(unblindList.size(), 2);
  EXPECT_EQ(unblindList[0].value.GetAmount().GetSatoshiValue(), 80000);
  EXPECT_EQ(unblindList[1].value.GetAmount().GetSatoshiValue(), 10000);
}